

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O0

void __thiscall streams_tests::streams_vector_writer::test_method(streams_vector_writer *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  uchar b;
  uchar a;
  uchar bytes [4];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff2c8;
  undefined7 in_stack_fffffffffffff2d0;
  undefined1 in_stack_fffffffffffff2d7;
  assertion_result *in_stack_fffffffffffff2d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined7 in_stack_fffffffffffff2e0;
  undefined1 in_stack_fffffffffffff2e7;
  VectorWriter *in_stack_fffffffffffff2e8;
  undefined7 in_stack_fffffffffffff2f0;
  undefined1 in_stack_fffffffffffff2f7;
  VectorWriter *in_stack_fffffffffffff2f8;
  const_string *in_stack_fffffffffffff300;
  const_string *file;
  undefined7 in_stack_fffffffffffff308;
  undefined1 in_stack_fffffffffffff30f;
  lazy_ostream *in_stack_fffffffffffff310;
  undefined7 in_stack_fffffffffffff318;
  undefined1 in_stack_fffffffffffff31f;
  const_string local_9c0 [2];
  lazy_ostream local_9a0 [2];
  VectorWriter local_979;
  assertion_result local_960 [3];
  const_string local_918 [2];
  lazy_ostream local_8f8 [4];
  assertion_result local_8b8 [3];
  undefined1 local_869;
  const_string local_868 [2];
  lazy_ostream local_848 [4];
  assertion_result local_808 [3];
  const_string local_7c0 [2];
  lazy_ostream local_7a0 [4];
  assertion_result local_760 [3];
  const_string local_718 [2];
  lazy_ostream local_6f8 [4];
  assertion_result local_6b8 [3];
  const_string local_670 [2];
  lazy_ostream local_650 [4];
  assertion_result local_610 [3];
  undefined1 local_5c1;
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [4];
  assertion_result local_560 [3];
  const_string local_518 [2];
  lazy_ostream local_4f8 [4];
  assertion_result local_4b8 [3];
  undefined1 local_469;
  const_string local_468 [2];
  lazy_ostream local_448 [4];
  assertion_result local_408 [3];
  const_string local_3c0 [2];
  lazy_ostream local_3a0 [4];
  assertion_result local_360 [3];
  undefined1 local_311;
  const_string local_310 [2];
  lazy_ostream local_2f0 [4];
  assertion_result local_2b0 [3];
  const_string local_268 [2];
  lazy_ostream local_248 [4];
  assertion_result local_208 [3];
  const_string local_1c0 [2];
  lazy_ostream local_1a0 [4];
  assertion_result local_160 [3];
  const_string local_118 [2];
  lazy_ostream local_f8 [4];
  assertion_result local_b8 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined4 local_1c;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_51 = 1;
  local_52 = 2;
  local_1c = 0x6050403;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_1e = 1;
    local_1d = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l._M_len._0_7_ = in_stack_fffffffffffff318;
    __l._M_array = (iterator)in_stack_fffffffffffff310;
    __l._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b8,local_f8,local_118,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_20 = 1;
    local_1f = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_00._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_00._M_array = (iterator)in_stack_fffffffffffff310;
    __l_00._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_00,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_160,local_1a0,local_1c0,0x56,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_24 = 0;
    local_23 = 0;
    local_22 = 1;
    local_21 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_01._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_01._M_array = (iterator)in_stack_fffffffffffff310;
    __l_01._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_01,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_208,local_248,local_268,0x5a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_28 = 0;
    local_27 = 0;
    local_26 = 1;
    local_25 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_02._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_02._M_array = (iterator)in_stack_fffffffffffff310;
    __l_02._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_02,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b0,local_2f0,local_310,0x5c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  local_311 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2f8,
             CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
             (value_type_conflict3 *)in_stack_fffffffffffff2e8);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_2d = 0;
    local_2c = 0;
    local_2b = 1;
    local_2a = 2;
    local_29 = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_03._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_03._M_array = (iterator)in_stack_fffffffffffff310;
    __l_03._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_03,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_360,local_3a0,local_3c0,0x61,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_32 = 0;
    local_31 = 0;
    local_30 = 1;
    local_2f = 2;
    local_2e = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_04._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_04._M_array = (iterator)in_stack_fffffffffffff310;
    __l_04._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_04,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_408,local_448,local_468,99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  local_469 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2f8,
             CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
             (value_type_conflict3 *)in_stack_fffffffffffff2e8);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_37 = 0;
    local_36 = 0;
    local_35 = 0;
    local_34 = 1;
    local_33 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_05._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_05._M_array = (iterator)in_stack_fffffffffffff310;
    __l_05._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_05,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b8,local_4f8,local_518,0x68,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_3c = 0;
    local_3b = 0;
    local_3a = 0;
    local_39 = 1;
    local_38 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_06._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_06._M_array = (iterator)in_stack_fffffffffffff310;
    __l_06._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_06,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_560,local_5a0,local_5c0,0x6a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  local_5c1 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2f8,
             CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
             (value_type_conflict3 *)in_stack_fffffffffffff2e8);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_42 = 0;
    local_41 = 0;
    local_40 = 0;
    local_3f = 0;
    local_3e = 1;
    local_3d = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_07._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_07._M_array = (iterator)in_stack_fffffffffffff310;
    __l_07._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_07,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_610,local_650,local_670,0x6f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char&>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
             (uchar *)in_stack_fffffffffffff2c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_48 = 0;
    local_47 = 0;
    local_46 = 0;
    local_45 = 0;
    local_44 = 1;
    local_43 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_08._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_08._M_array = (iterator)in_stack_fffffffffffff310;
    __l_08._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_08,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6b8,local_6f8,local_718,0x71,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  VectorWriter::VectorWriter<unsigned_char(&)[4]>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar (*) [4])CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_4c = 3;
    local_4b = 4;
    local_4a = 5;
    local_49 = 6;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_09._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_09._M_array = (iterator)in_stack_fffffffffffff310;
    __l_09._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_09,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_760,local_7a0,local_7c0,0x75,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VectorWriter::VectorWriter<unsigned_char(&)[4]>
            (in_stack_fffffffffffff2e8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (size_t)in_stack_fffffffffffff2d8,
             (uchar (*) [4])CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_50 = 3;
    local_4f = 4;
    local_4e = 5;
    local_4d = 6;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_10._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_10._M_array = (iterator)in_stack_fffffffffffff310;
    __l_10._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_10,
               (allocator_type *)in_stack_fffffffffffff300);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2f8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_808,local_848,local_868,0x77,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  local_869 = 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2f8,
             CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
             (value_type_conflict3 *)in_stack_fffffffffffff2e8);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char(&)[4],unsigned_char&>
            (in_stack_fffffffffffff2f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
             (size_t)in_stack_fffffffffffff2e8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (uchar (*) [4])in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
               in_stack_fffffffffffff300,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_10 = 8;
    local_f = 8;
    local_e = 1;
    local_d = 3;
    local_c = 4;
    local_b = 5;
    local_a = 6;
    local_9 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_11._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_11._M_array = (iterator)in_stack_fffffffffffff310;
    __l_11._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_11,
               (allocator_type *)in_stack_fffffffffffff300);
    in_stack_fffffffffffff31f =
         std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff2f8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    in_stack_fffffffffffff310 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b8,local_8f8,local_918,0x7c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    in_stack_fffffffffffff30f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff30f);
  VectorWriter::VectorWriter<unsigned_char&,unsigned_char(&)[4],unsigned_char&>
            (in_stack_fffffffffffff2f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
             (size_t)in_stack_fffffffffffff2e8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e0),
             (uchar (*) [4])in_stack_fffffffffffff2d8,
             (uchar *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0));
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),file
               ,(size_t)in_stack_fffffffffffff2f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    local_18 = 8;
    local_17 = 8;
    local_16 = 1;
    local_15 = 3;
    local_14 = 4;
    local_13 = 5;
    local_12 = 6;
    local_11 = 2;
    in_stack_fffffffffffff2f8 = &local_979;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8);
    __l_12._M_len._0_7_ = in_stack_fffffffffffff318;
    __l_12._M_array = (iterator)in_stack_fffffffffffff310;
    __l_12._M_len._7_1_ = in_stack_fffffffffffff31f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),__l_12,
               (allocator_type *)file);
    in_stack_fffffffffffff2f7 =
         std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff2f8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2d8,(bool)in_stack_fffffffffffff2d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2d8,
               (pointer)CONCAT17(in_stack_fffffffffffff2d7,in_stack_fffffffffffff2d0),
               (unsigned_long)in_stack_fffffffffffff2c8);
    in_stack_fffffffffffff2c8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_960,local_9a0,local_9c0,0x7e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2d8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff2c8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  this_00 = &local_70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_vector_writer)
{
    unsigned char a(1);
    unsigned char b(2);
    unsigned char bytes[] = { 3, 4, 5, 6 };
    std::vector<unsigned char> vch;

    // Each test runs twice. Serializing a second time at the same starting
    // point should yield the same results, even if the first test grew the
    // vector.

    VectorWriter{vch, 0, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{1, 2}}));
    VectorWriter{vch, 0, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{1, 2}}));
    vch.clear();

    VectorWriter{vch, 2, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 1, 2}}));
    VectorWriter{vch, 2, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 1, 2}}));
    vch.clear();

    vch.resize(5, 0);
    VectorWriter{vch, 2, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 1, 2, 0}}));
    VectorWriter{vch, 2, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 1, 2, 0}}));
    vch.clear();

    vch.resize(4, 0);
    VectorWriter{vch, 3, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 0, 1, 2}}));
    VectorWriter{vch, 3, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 0, 1, 2}}));
    vch.clear();

    vch.resize(4, 0);
    VectorWriter{vch, 4, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 0, 0, 1, 2}}));
    VectorWriter{vch, 4, a, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{0, 0, 0, 0, 1, 2}}));
    vch.clear();

    VectorWriter{vch, 0, bytes};
    BOOST_CHECK((vch == std::vector<unsigned char>{{3, 4, 5, 6}}));
    VectorWriter{vch, 0, bytes};
    BOOST_CHECK((vch == std::vector<unsigned char>{{3, 4, 5, 6}}));
    vch.clear();

    vch.resize(4, 8);
    VectorWriter{vch, 2, a, bytes, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{8, 8, 1, 3, 4, 5, 6, 2}}));
    VectorWriter{vch, 2, a, bytes, b};
    BOOST_CHECK((vch == std::vector<unsigned char>{{8, 8, 1, 3, 4, 5, 6, 2}}));
    vch.clear();
}